

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

string * __thiscall
tinyusdz::Stage::dump_prim_tree_abi_cxx11_(string *__return_storage_ptr__,Stage *this)

{
  pointer pPVar1;
  uint32_t in_ECX;
  Prim *root;
  pointer this_00;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1) {
    (anonymous_namespace)::DumpPrimTreeRec_abi_cxx11_
              (&local_1d0,(_anonymous_namespace_ *)this_00,(Prim *)0x0,in_ECX);
    ::std::operator<<(local_1a0,(string *)&local_1d0);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string Stage::dump_prim_tree() const {
  std::stringstream ss;

  for (const Prim &root : root_prims()) {
    ss << DumpPrimTreeRec(root, 0);
  }
  return ss.str();
}